

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_map.c
# Opt level: O0

void nhr_map_delete(_nhr_map_node *map)

{
  _nhr_map_node_struct *p_Var1;
  _nhr_map_node *last;
  _nhr_map_node *cur;
  _nhr_map_node *map_local;
  
  last = map;
  while (last != (_nhr_map_node *)0x0) {
    p_Var1 = last->next;
    nhr_string_delete(last->key);
    if (last->value_type < 3) {
      nhr_free((last->value).data);
    }
    if (last->reserved_type < 3) {
      nhr_free((last->reserved).data);
    }
    nhr_free(last);
    last = p_Var1;
  }
  return;
}

Assistant:

void nhr_map_delete(_nhr_map_node * map) {
	_nhr_map_node *cur = map, *last;
	while (cur) {
		last = cur;
		cur = cur->next;
		nhr_string_delete(last->key);
		if (last->value_type <= NHR_MAP_VALUE_STRING) {
			nhr_free(last->value.data);
		}
        if (last->reserved_type <= NHR_MAP_VALUE_STRING) {
            nhr_free(last->reserved.data);
        }
		nhr_free(last);
	}
}